

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

Expr * inclusive_or_expr(void)

{
  char cVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  
  pEVar2 = exclusive_or_expr();
  skip();
  cVar1 = *s;
  while ((cVar1 == '|' && (s[1] != '|'))) {
    s = s + 1;
    skip();
    pEVar3 = (Expr *)alloc(0x20);
    pEVar3->left = (Expr *)0x0;
    pEVar3->right = (Expr *)0x0;
    pEVar3->type = 10;
    skip();
    pEVar3->left = pEVar2;
    pEVar2 = exclusive_or_expr();
    pEVar3->right = pEVar2;
    cVar1 = *s;
    pEVar2 = pEVar3;
  }
  return pEVar2;
}

Assistant:

static struct Expr *inclusive_or_expr(void)
{
  struct Expr *left,*new;

  left = exclusive_or_expr();
  skip();
  while (s[0]=='|' && s[1]!='|') {
    s++;
    skip();
    new = new_expr();
    new->type = BOR;
    skip();
    new->left = left;
    new->right = exclusive_or_expr();
    left = new;
  }
  return left;
}